

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O0

void y_string_suite::y_string_unicode_U_plus_10FFFE_nonchar(void)

{
  undefined4 local_1e8;
  value local_1e4 [2];
  undefined4 local_1dc;
  value local_1d8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined4 local_1a8;
  value local_1a4 [6];
  undefined4 local_18c;
  value local_188 [2];
  basic_string_view<char,_std::char_traits<char>_> local_180;
  undefined1 local_170 [8];
  reader reader;
  char input [17];
  
  reader.stack.c.
  super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x46464244755c225b;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_180,
             (char *)&reader.stack.c.
                      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  trial::protocol::json::basic_reader<char>::basic_reader
            ((basic_reader<char> *)local_170,&local_180);
  local_188[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_18c = 0xc;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf46,"void y_string_suite::y_string_unicode_U_plus_10FFFE_nonchar()",local_188,
             &local_18c);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_1a4[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_1a8 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf48,"void y_string_suite::y_string_unicode_U_plus_10FFFE_nonchar()",local_1a4,
             &local_1a8);
  trial::protocol::json::basic_reader<char>::value<std::__cxx11::string>
            (&local_1d0,(basic_reader<char> *)local_170);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[7]>
            ("reader.value<std::string>()","\"\\xED\\xAF\\xBF\\xED\\xBF\\xBE\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf49,"void y_string_suite::y_string_unicode_U_plus_10FFFE_nonchar()",&local_1d0,
             anon_var_dwarf_5e65);
  std::__cxx11::string::~string((string *)&local_1d0);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_1d8[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_1dc = 0xd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf4b,"void y_string_suite::y_string_unicode_U_plus_10FFFE_nonchar()",local_1d8,
             &local_1dc);
  trial::protocol::json::basic_reader<char>::next((basic_reader<char> *)local_170);
  local_1e4[0] = trial::protocol::json::basic_reader<char>::code((basic_reader<char> *)local_170);
  local_1e8 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0xf4d,"void y_string_suite::y_string_unicode_U_plus_10FFFE_nonchar()",local_1e4,
             &local_1e8);
  trial::protocol::json::basic_reader<char>::~basic_reader((basic_reader<char> *)local_170);
  return;
}

Assistant:

void y_string_unicode_U_plus_10FFFE_nonchar()
{
    const char input[] = "[\"\\uDBFF\\uDFFE\"]";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "\xED\xAF\xBF\xED\xBF\xBE");
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_array);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}